

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O0

void deserialize_run_container_should_combine(void)

{
  uint8_t data [19];
  uint5 in_stack_fffffffffffffffb;
  
  invalid_deserialize_test
            ((void *)data._0_8_,(ulong)in_stack_fffffffffffffffb << 0x18,(char *)0x100000000000200);
  return;
}

Assistant:

DEFINE_TEST(deserialize_run_container_should_combine) {
    // clang-format off
    const uint8_t data[] = {
        0x3B, 0x30, // Serial Cookie
        0, 0,       // Container count - 1
        0x01,       // Run Flag Bitset (single container is a run)
        0, 0,       // Upper 16 bits of the first container
        1, 0,       // Cardinality - 1 of the first container
        2, 0,       // First Container - Number of runs
        0, 0,       // First run start
        0, 0,       // First run length - 1
        1, 0,       // Second run start (STARTS AT THE END OF THE FIRST)
        0, 0,       // Second run length - 1
    };
    // clang-format on
    invalid_deserialize_test(data, sizeof(data),
                             "ranges shouldn't be contiguous");
}